

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

pair<slang::parsing::Trivia,_slang::parsing::Trivia> * __thiscall
slang::parsing::Preprocessor::handleProtectedDirective(Preprocessor *this,Token directive)

{
  SourceLocation location;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  Token directive_00;
  Token directive_01;
  bool bVar1;
  SourceLocation SVar2;
  DiagCode extraout_var;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Info *pIVar3;
  EVP_PKEY_CTX *src;
  span<slang::parsing::Token,_18446744073709551615UL> *__s;
  long in_RSI;
  Preprocessor *in_RDI;
  Trivia TVar4;
  Trivia skippedTrivia;
  Token token;
  SmallVector<slang::parsing::Token,_4UL> skipped;
  Token *in_stack_fffffffffffffe78;
  TriviaKind kind;
  Preprocessor *in_stack_fffffffffffffe80;
  uint32_t in_stack_fffffffffffffe88;
  undefined4 uVar5;
  ProtectEncoding in_stack_fffffffffffffe8c;
  undefined4 uVar6;
  int in_stack_fffffffffffffe90;
  DiagCode in_stack_fffffffffffffe94;
  Preprocessor *this_00;
  SmallVectorBase<slang::parsing::Token> *pSVar7;
  undefined6 local_120;
  undefined1 local_108 [16];
  undefined8 local_f8;
  char *local_d8;
  uint32_t local_d0;
  undefined2 local_cc;
  anon_union_12_4_39e54f29_for_Trivia_0 local_c8;
  undefined2 local_bc;
  SourceLocation local_b8;
  undefined4 local_ac;
  Token local_a8 [2];
  undefined8 local_88;
  undefined8 uStack_80;
  SmallVectorBase<slang::parsing::Token> local_70 [2];
  undefined8 local_10;
  undefined8 uStack_8;
  
  pSVar7 = local_70;
  this_00 = in_RDI;
  local_10 = in_RDX;
  uStack_8 = in_RCX;
  SmallVector<slang::parsing::Token,_4UL>::SmallVector
            ((SmallVector<slang::parsing::Token,_4UL> *)0x36c298);
  local_88 = local_10;
  uStack_80 = uStack_8;
  directive_01.info = (Info *)pSVar7;
  directive_01.kind = (short)in_RSI;
  directive_01._2_1_ = (char)((ulong)in_RSI >> 0x10);
  directive_01.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  directive_01.rawLen = (int)((ulong)in_RSI >> 0x20);
  skipMacroTokensBeforeProtectRegion
            (this_00,directive_01,(SmallVectorBase<slang::parsing::Token> *)in_RDI);
  SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  ::back((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
          *)(in_RSI + 0xf8));
  std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>::operator->
            ((unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
             0x36c2eb);
  local_a8[0] = Lexer::lexEncodedText
                          ((Lexer *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                           SUB81((ulong)in_stack_fffffffffffffe80 >> 0x38,0),
                           SUB81((ulong)in_stack_fffffffffffffe80 >> 0x30,0));
  pIVar3 = local_a8[0].info;
  SmallVectorBase<slang::parsing::Token>::push_back
            ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  kind = (TriviaKind)((ulong)in_stack_fffffffffffffe78 >> 0x38);
  local_ac = 0x280004;
  SVar2 = Token::location(local_a8);
  location._4_4_ = in_stack_fffffffffffffe8c;
  location._0_4_ = in_stack_fffffffffffffe88;
  local_b8 = SVar2;
  addDiag(in_stack_fffffffffffffe80,in_stack_fffffffffffffe94,location);
  Trivia::Trivia((Trivia *)&local_c8.rawText);
  bVar1 = SmallVectorBase<slang::parsing::Token>::empty(local_70);
  if (!bVar1) {
    in_stack_fffffffffffffe90 =
         SmallVectorBase<slang::parsing::Token>::copy(local_70,*(EVP_PKEY_CTX **)(in_RSI + 8),src);
    uVar5 = SUB84(__s,0);
    uVar6 = (undefined4)((ulong)__s >> 0x20);
    local_f8 = CONCAT44(extraout_var,in_stack_fffffffffffffe90);
    in_stack_fffffffffffffe94 = extraout_var;
    std::span<const_slang::parsing::Token,_18446744073709551615UL>::
    span<slang::parsing::Token,_18446744073709551615UL>
              ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
               CONCAT44(extraout_var,in_stack_fffffffffffffe90),__s);
    tokens._M_ptr._4_4_ = uVar6;
    tokens._M_ptr._0_4_ = uVar5;
    tokens._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffe90;
    tokens._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffe94;
    Trivia::Trivia((Trivia *)in_stack_fffffffffffffe80,kind,tokens);
    local_c8.rawText.ptr = local_d8;
    local_c8.rawText.len = local_d0;
    local_bc = local_cc;
  }
  directive_00.info = pIVar3;
  directive_00._0_8_ = SVar2;
  TVar4 = createSimpleDirective
                    ((Preprocessor *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     directive_00);
  local_120 = TVar4._8_6_;
  local_108._8_6_ = local_120;
  local_108._0_6_ = TVar4.field_0._0_6_;
  local_108._6_2_ = TVar4.field_0._6_2_;
  std::pair<slang::parsing::Trivia,_slang::parsing::Trivia>::
  pair<slang::parsing::Trivia,_slang::parsing::Trivia_&,_true>
            ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)in_RDI,(Trivia *)local_108,
             (Trivia *)&local_c8.rawText);
  SmallVector<slang::parsing::Token,_4UL>::~SmallVector
            ((SmallVector<slang::parsing::Token,_4UL> *)0x36c4f7);
  return (pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)this_00;
}

Assistant:

std::pair<Trivia, Trivia> Preprocessor::handleProtectedDirective(Token directive) {
    // This is handling legacy Verilog-XL style `protected directives.
    SmallVector<Token, 4> skipped;
    skipMacroTokensBeforeProtectRegion(directive, skipped);

    Token token = lexerStack.back()->lexEncodedText(ProtectEncoding::Raw, 0,
                                                    /* isSingleLine */ false,
                                                    /* legacyProtectedMode */ true);
    skipped.push_back(token);

    addDiag(diag::ProtectedEnvelope, token.location());

    Trivia skippedTrivia;
    if (!skipped.empty())
        skippedTrivia = Trivia(TriviaKind::SkippedTokens, skipped.copy(alloc));

    return {createSimpleDirective(directive), skippedTrivia};
}